

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mempool_persist.cpp
# Opt level: O0

bool node::LoadMempool(CTxMemPool *pool,path *load_path,Chainstate *active_chainstate,
                      ImportMempoolOptions *opts)

{
  string_view source_file;
  string_view source_file_00;
  string_view source_file_01;
  string_view source_file_02;
  string_view logging_function;
  string_view logging_function_00;
  string_view logging_function_01;
  string_view logging_function_02;
  bool bVar1;
  time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  active_chainstate_00;
  rep accept_time;
  AnnotatedMixin<std::recursive_mutex> *pAVar2;
  GenTxid *gtxid;
  long in_RCX;
  CTxMemPool *in_RDI;
  long in_FS_OFFSET;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  ParamsWrapper<TransactionSerParams,_std::shared_ptr<const_CTransaction>_> PVar6;
  exception *e;
  uint256 *txid;
  set<uint256,_std::less<uint256>,_std::allocator<uint256>_> *__range3_1;
  pair<const_uint256,_long> *i;
  map<uint256,_long,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_long>_>_> *__range3
  ;
  MempoolAcceptResult *accepted;
  int next_tenth_to_report;
  iterator __end3_1;
  iterator __begin3_1;
  iterator __end3;
  iterator __begin3;
  CAmount amountdelta;
  int64_t nFeeDelta;
  int64_t nTime;
  CTransactionRef tx;
  int percentage_done;
  uint64_t txns_tried;
  uint64_t total_txns_to_load;
  vector<std::byte,_std::allocator<std::byte>_> xor_key;
  uint64_t version;
  time_point now;
  int64_t unbroadcast;
  int64_t already_there;
  int64_t failed;
  int64_t expired;
  int64_t count;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock7;
  AutoFile file;
  set<uint256,_std::less<uint256>,_std::allocator<uint256>_> unbroadcast_txids;
  map<uint256,_long,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_long>_>_> mapDeltas
  ;
  undefined4 in_stack_fffffffffffffb08;
  undefined4 in_stack_fffffffffffffb0c;
  vector<std::byte,_std::allocator<std::byte>_> *in_stack_fffffffffffffb10;
  char *obj;
  time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  in_stack_fffffffffffffb18;
  function<_IO_FILE_*(const_fs::path_&,_const_char_*)> *in_stack_fffffffffffffb20;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffb28;
  char *in_stack_fffffffffffffb30;
  uint256 *in_stack_fffffffffffffb38;
  CTxMemPool *in_stack_fffffffffffffb40;
  undefined6 in_stack_fffffffffffffb48;
  undefined1 in_stack_fffffffffffffb4e;
  byte in_stack_fffffffffffffb4f;
  AutoFile *in_stack_fffffffffffffb50;
  CTxMemPool *this;
  vector<std::byte,_std::allocator<std::byte>_> *in_stack_fffffffffffffb58;
  undefined6 in_stack_fffffffffffffb60;
  undefined1 in_stack_fffffffffffffb66;
  undefined1 in_stack_fffffffffffffb67;
  CTxMemPool *in_stack_fffffffffffffb70;
  Txid *in_stack_fffffffffffffb78;
  int iVar7;
  CTransactionRef *tx_00;
  ConstevalFormatString<3U> in_stack_fffffffffffffbb8;
  undefined1 *in_stack_fffffffffffffbc0;
  shared_ptr<const_CTransaction> *in_stack_fffffffffffffbc8;
  TransactionSerParams *in_stack_fffffffffffffbd0;
  int in_stack_fffffffffffffbd8;
  undefined4 in_stack_fffffffffffffbdc;
  undefined4 uVar8;
  int local_3bc;
  byte local_369;
  Level in_stack_fffffffffffffcb0;
  unsigned_long *in_stack_fffffffffffffcc0;
  unsigned_long *in_stack_fffffffffffffcc8;
  unsigned_long *in_stack_fffffffffffffcd0;
  long *in_stack_fffffffffffffcd8;
  long *in_stack_fffffffffffffce0;
  long local_2d0;
  CTransactionRef *local_2c8;
  undefined1 local_2c0 [16];
  basic_string_view<char,_std::char_traits<char>_> local_2b0 [2];
  undefined1 local_284 [36];
  undefined1 local_260 [64];
  long local_220;
  duration local_218;
  size_type local_210;
  long local_208;
  long local_200;
  long local_1f8;
  long local_1f0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  int local_e8;
  _Base_ptr local_8;
  undefined2 uVar3;
  
  local_8 = *(_Base_ptr *)(in_FS_OFFSET + 0x28);
  bVar1 = std::filesystem::__cxx11::path::empty
                    ((path *)CONCAT44(in_stack_fffffffffffffb0c,in_stack_fffffffffffffb08));
  if (bVar1) {
    local_369 = 0;
  }
  else {
    std::function<_IO_FILE_*(const_fs::path_&,_const_char_*)>::operator()
              (in_stack_fffffffffffffb20,(path *)in_stack_fffffffffffffb18.__d.__r,
               (char *)in_stack_fffffffffffffb28);
    local_1c8 = 0;
    uStack_1c0 = 0;
    local_1b8 = 0;
    std::vector<std::byte,_std::allocator<std::byte>_>::vector
              ((vector<std::byte,_std::allocator<std::byte>_> *)
               CONCAT44(in_stack_fffffffffffffb0c,in_stack_fffffffffffffb08));
    AutoFile::AutoFile(in_stack_fffffffffffffb50,
                       (FILE *)CONCAT17(in_stack_fffffffffffffb4f,
                                        CONCAT16(in_stack_fffffffffffffb4e,in_stack_fffffffffffffb48
                                                )),
                       (vector<std::byte,_std::allocator<std::byte>_> *)in_stack_fffffffffffffb40);
    std::vector<std::byte,_std::allocator<std::byte>_>::~vector
              ((vector<std::byte,_std::allocator<std::byte>_> *)in_stack_fffffffffffffb18.__d.__r);
    bVar1 = AutoFile::IsNull((AutoFile *)
                             CONCAT44(in_stack_fffffffffffffb0c,in_stack_fffffffffffffb08));
    iVar7 = (int)((ulong)in_stack_fffffffffffffb78 >> 0x20);
    uVar8 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffbdc);
    if (bVar1) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_fffffffffffffb28,(char *)in_stack_fffffffffffffb20);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_fffffffffffffb28,(char *)in_stack_fffffffffffffb20);
      in_stack_fffffffffffffb08 = 2;
      logging_function._M_str._0_4_ = in_stack_fffffffffffffbd8;
      logging_function._M_len = (size_t)in_stack_fffffffffffffbd0;
      logging_function._M_str._4_4_ = uVar8;
      source_file._M_str = (char *)in_stack_fffffffffffffbc8;
      source_file._M_len = (size_t)in_stack_fffffffffffffbc0;
      LogPrintFormatInternal<>
                (logging_function,source_file,iVar7,(LogFlags)in_stack_fffffffffffffb70,
                 in_stack_fffffffffffffcb0,(ConstevalFormatString<0U>)in_stack_fffffffffffffbb8.fmt)
      ;
      local_369 = 0;
    }
    else {
      local_1f0 = 0;
      local_1f8 = 0;
      local_200 = 0;
      local_208 = 0;
      local_210 = 0;
      local_218.__r = (rep)NodeClock::now();
      AutoFile::operator>>
                ((AutoFile *)in_stack_fffffffffffffb18.__d.__r,
                 (unsigned_long *)in_stack_fffffffffffffb10);
      std::vector<std::byte,_std::allocator<std::byte>_>::vector
                ((vector<std::byte,_std::allocator<std::byte>_> *)
                 CONCAT44(in_stack_fffffffffffffb0c,in_stack_fffffffffffffb08));
      iVar7 = (int)((ulong)in_stack_fffffffffffffb78 >> 0x20);
      PVar6.m_object = in_stack_fffffffffffffbc8;
      PVar6.m_params = in_stack_fffffffffffffbd0;
      if (local_220 == 1) {
LAB_011dd08f:
        std::vector<std::byte,_std::allocator<std::byte>_>::vector
                  ((vector<std::byte,_std::allocator<std::byte>_> *)
                   CONCAT17(in_stack_fffffffffffffb67,
                            CONCAT16(in_stack_fffffffffffffb66,in_stack_fffffffffffffb60)),
                   in_stack_fffffffffffffb58);
        AutoFile::SetXor((AutoFile *)CONCAT44(in_stack_fffffffffffffb0c,in_stack_fffffffffffffb08),
                         (vector<std::byte,_std::allocator<std::byte>_> *)0x11dd0bb);
        std::vector<std::byte,_std::allocator<std::byte>_>::~vector
                  ((vector<std::byte,_std::allocator<std::byte>_> *)
                   in_stack_fffffffffffffb18.__d.__r);
        AutoFile::operator>>
                  ((AutoFile *)in_stack_fffffffffffffb18.__d.__r,
                   (unsigned_long *)in_stack_fffffffffffffb10);
        local_260._0_8_ = (void *)0x0;
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (in_stack_fffffffffffffb28,(char *)in_stack_fffffffffffffb20);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (in_stack_fffffffffffffb28,(char *)in_stack_fffffffffffffb20);
        in_stack_fffffffffffffb18.__d.__r = (duration)(local_260 + 8);
        obj = "Loading %u mempool transactions from file...\n";
        in_stack_fffffffffffffb08 = 2;
        logging_function_00._M_str._0_4_ = in_stack_fffffffffffffbd8;
        logging_function_00._M_len = (size_t)in_stack_fffffffffffffbd0;
        logging_function_00._M_str._4_4_ = uVar8;
        source_file_00._M_str = (char *)in_stack_fffffffffffffbc8;
        source_file_00._M_len = (size_t)in_stack_fffffffffffffbc0;
        LogPrintFormatInternal<unsigned_long>
                  (logging_function_00,source_file_00,
                   (int)((ulong)in_stack_fffffffffffffb78 >> 0x20),
                   (LogFlags)in_stack_fffffffffffffb70,in_stack_fffffffffffffcb0,
                   (ConstevalFormatString<1U>)in_stack_fffffffffffffbb8.fmt,
                   in_stack_fffffffffffffcc0);
        PVar6.m_object = in_stack_fffffffffffffbc8;
        PVar6.m_params = in_stack_fffffffffffffbd0;
        local_3bc = 0;
LAB_011dd184:
        if ((ulong)local_260._0_8_ < (ulong)local_260._8_8_) goto code_r0x011dd19a;
        std::
        map<uint256,_long,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_long>_>_>::
        map((map<uint256,_long,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_long>_>_>
             *)CONCAT44(in_stack_fffffffffffffb0c,in_stack_fffffffffffffb08));
        AutoFile::operator>>
                  ((AutoFile *)in_stack_fffffffffffffb18.__d.__r,
                   (map<uint256,_long,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_long>_>_>
                    *)obj);
        if ((*(byte *)(in_RCX + 0x21) & 1) != 0) {
          std::
          map<uint256,_long,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_long>_>_>::
          begin((map<uint256,_long,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_long>_>_>
                 *)obj);
          std::
          map<uint256,_long,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_long>_>_>::
          end((map<uint256,_long,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_long>_>_>
               *)obj);
          while (bVar1 = std::operator==((_Self *)in_stack_fffffffffffffb18.__d.__r,(_Self *)obj),
                ((bVar1 ^ 0xffU) & 1) != 0) {
            std::_Rb_tree_iterator<std::pair<const_uint256,_long>_>::operator*
                      ((_Rb_tree_iterator<std::pair<const_uint256,_long>_> *)
                       CONCAT44(in_stack_fffffffffffffb0c,in_stack_fffffffffffffb08));
            CTxMemPool::PrioritiseTransaction
                      ((CTxMemPool *)CONCAT44(uVar8,in_stack_fffffffffffffbd8),
                       (uint256 *)PVar6.m_params,(CAmount *)PVar6.m_object);
            std::_Rb_tree_iterator<std::pair<const_uint256,_long>_>::operator++
                      ((_Rb_tree_iterator<std::pair<const_uint256,_long>_> *)
                       CONCAT44(in_stack_fffffffffffffb0c,in_stack_fffffffffffffb08));
          }
        }
        this = (CTxMemPool *)&stack0xfffffffffffffe90;
        _GLOBAL__N_1::std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>::set
                  ((set<uint256,_std::less<uint256>,_std::allocator<uint256>_> *)
                   CONCAT44(in_stack_fffffffffffffb0c,in_stack_fffffffffffffb08));
        AutoFile::operator>>
                  ((AutoFile *)in_stack_fffffffffffffb18.__d.__r,
                   (set<uint256,_std::less<uint256>,_std::allocator<uint256>_> *)obj);
        iVar7 = (int)((ulong)in_stack_fffffffffffffb78 >> 0x20);
        if ((*(byte *)(in_RCX + 0x22) & 1) != 0) {
          local_210 = std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>::size
                                ((set<uint256,_std::less<uint256>,_std::allocator<uint256>_> *)
                                 CONCAT44(in_stack_fffffffffffffb0c,in_stack_fffffffffffffb08));
          std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>::begin
                    ((set<uint256,_std::less<uint256>,_std::allocator<uint256>_> *)obj);
          std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>::end
                    ((set<uint256,_std::less<uint256>,_std::allocator<uint256>_> *)obj);
          while( true ) {
            bVar1 = std::operator==((_Self *)in_stack_fffffffffffffb18.__d.__r,(_Self *)obj);
            iVar7 = (int)((ulong)in_stack_fffffffffffffb78 >> 0x20);
            if (((bVar1 ^ 0xffU) & 1) == 0) break;
            std::_Rb_tree_const_iterator<uint256>::operator*
                      ((_Rb_tree_const_iterator<uint256> *)
                       CONCAT44(in_stack_fffffffffffffb0c,in_stack_fffffffffffffb08));
            CTxMemPool::get(this,(uint256 *)
                                 CONCAT17(in_stack_fffffffffffffb4f,
                                          CONCAT16(in_stack_fffffffffffffb4e,
                                                   in_stack_fffffffffffffb48)));
            bVar1 = std::operator==((shared_ptr<const_CTransaction> *)
                                    in_stack_fffffffffffffb18.__d.__r,obj);
            in_stack_fffffffffffffb4f = bVar1 ^ 0xff;
            std::shared_ptr<const_CTransaction>::~shared_ptr
                      ((shared_ptr<const_CTransaction> *)
                       CONCAT44(in_stack_fffffffffffffb0c,in_stack_fffffffffffffb08));
            if ((in_stack_fffffffffffffb4f & 1) != 0) {
              CTxMemPool::AddUnbroadcastTx(in_stack_fffffffffffffb40,in_stack_fffffffffffffb38);
            }
            std::_Rb_tree_const_iterator<uint256>::operator++
                      ((_Rb_tree_const_iterator<uint256> *)
                       CONCAT44(in_stack_fffffffffffffb0c,in_stack_fffffffffffffb08));
          }
        }
        std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>::~set
                  ((set<uint256,_std::less<uint256>,_std::allocator<uint256>_> *)
                   CONCAT44(in_stack_fffffffffffffb0c,in_stack_fffffffffffffb08));
        std::
        map<uint256,_long,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_long>_>_>::
        ~map((map<uint256,_long,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_long>_>_>
              *)CONCAT44(in_stack_fffffffffffffb0c,in_stack_fffffffffffffb08));
        bVar1 = false;
        goto LAB_011dd9fb;
      }
      if (local_220 == 2) {
        AutoFile::operator>>
                  ((AutoFile *)in_stack_fffffffffffffb18.__d.__r,in_stack_fffffffffffffb10);
        goto LAB_011dd08f;
      }
      local_369 = 0;
      bVar1 = true;
LAB_011dd9fb:
      std::vector<std::byte,_std::allocator<std::byte>_>::~vector
                ((vector<std::byte,_std::allocator<std::byte>_> *)in_stack_fffffffffffffb18.__d.__r)
      ;
      if (bVar1 == false) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (in_stack_fffffffffffffb28,(char *)in_stack_fffffffffffffb20);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (in_stack_fffffffffffffb28,(char *)in_stack_fffffffffffffb20);
        in_stack_fffffffffffffb08 = 2;
        logging_function_02._M_str._0_4_ = in_stack_fffffffffffffbd8;
        logging_function_02._M_len = (size_t)PVar6.m_params;
        logging_function_02._M_str._4_4_ = uVar8;
        source_file_02._M_str = (char *)PVar6.m_object;
        source_file_02._M_len = (size_t)in_stack_fffffffffffffbc0;
        LogPrintFormatInternal<long,long,long,long,long>
                  (logging_function_02,source_file_02,iVar7,(LogFlags)in_stack_fffffffffffffb70,
                   in_stack_fffffffffffffcb0,
                   (ConstevalFormatString<5U>)in_stack_fffffffffffffbb8.fmt,
                   (long *)in_stack_fffffffffffffcc0,(long *)in_stack_fffffffffffffcc8,
                   (long *)in_stack_fffffffffffffcd0,in_stack_fffffffffffffcd8,
                   in_stack_fffffffffffffce0);
        local_369 = 1;
      }
    }
    AutoFile::~AutoFile((AutoFile *)CONCAT44(in_stack_fffffffffffffb0c,in_stack_fffffffffffffb08));
  }
  if (*(_Base_ptr *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (bool)(local_369 & 1);
code_r0x011dd19a:
  auVar4._8_4_ = SUB84(local_260._0_8_,4);
  auVar4._0_8_ = local_260._0_8_;
  auVar4._12_4_ = 0x45300000;
  auVar5._8_4_ = SUB84(local_260._8_8_,4);
  auVar5._0_8_ = local_260._8_8_;
  auVar5._12_4_ = 0x45300000;
  local_284._0_4_ =
       (undefined4)
       ((((auVar4._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)local_260._0_8_) - 4503599627370496.0)) * 100.0) /
       ((auVar5._8_8_ - 1.9342813113834067e+25) +
       ((double)CONCAT44(0x43300000,(int)local_260._8_8_) - 4503599627370496.0)));
  in_stack_fffffffffffffbd8 = local_3bc;
  if (local_3bc < (int)local_284._0_4_ / 10) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffb28,(char *)in_stack_fffffffffffffb20);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffb28,(char *)in_stack_fffffffffffffb20);
    local_2b0[0]._M_len = local_260._8_8_ - local_260._0_8_;
    in_stack_fffffffffffffb28 = local_2b0;
    in_stack_fffffffffffffb20 = (function<_IO_FILE_*(const_fs::path_&,_const_char_*)> *)local_260;
    in_stack_fffffffffffffb18.__d.__r = (duration)local_284;
    obj = "Progress loading mempool transactions from file: %d%% (tried %u, %u remaining)\n";
    in_stack_fffffffffffffb08 = 2;
    logging_function_01._M_str._0_4_ = local_3bc;
    logging_function_01._M_len = (size_t)PVar6.m_params;
    logging_function_01._M_str._4_4_ = uVar8;
    source_file_01._M_str = (char *)PVar6.m_object;
    source_file_01._M_len = (size_t)in_stack_fffffffffffffbc0;
    LogPrintFormatInternal<int,unsigned_long,unsigned_long>
              (logging_function_01,source_file_01,(int)((ulong)in_stack_fffffffffffffb78 >> 0x20),
               (LogFlags)in_stack_fffffffffffffb70,in_stack_fffffffffffffcb0,
               in_stack_fffffffffffffbb8,(int *)in_stack_fffffffffffffcc0,in_stack_fffffffffffffcc8,
               in_stack_fffffffffffffcd0);
    in_stack_fffffffffffffbd8 = local_3bc;
    local_3bc = (int)local_284._0_4_ / 10;
  }
  local_260._0_8_ = local_260._0_8_ + 1;
  in_stack_fffffffffffffbc0 = local_2c0;
  std::shared_ptr<const_CTransaction>::shared_ptr
            ((shared_ptr<const_CTransaction> *)
             CONCAT44(in_stack_fffffffffffffb0c,in_stack_fffffffffffffb08));
  PVar6 = TransactionSerParams::operator()
                    ((TransactionSerParams *)in_stack_fffffffffffffb18.__d.__r,
                     (shared_ptr<const_CTransaction> *)obj);
  AutoFile::operator>>
            ((AutoFile *)in_stack_fffffffffffffb18.__d.__r,
             (ParamsWrapper<TransactionSerParams,_std::shared_ptr<const_CTransaction>_> *)obj);
  AutoFile::operator>>((AutoFile *)in_stack_fffffffffffffb18.__d.__r,(long *)obj);
  AutoFile::operator>>((AutoFile *)in_stack_fffffffffffffb18.__d.__r,(long *)obj);
  if ((*(byte *)(in_RCX + 0x20) & 1) != 0) {
    in_stack_fffffffffffffbb8.fmt =
         (char *)TicksSinceEpoch<std::chrono::duration<long,std::ratio<1l,1l>>,std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>
                           (in_stack_fffffffffffffb18);
    local_2c8 = (CTransactionRef *)in_stack_fffffffffffffbb8.fmt;
  }
  if ((local_2d0 != 0) && ((*(byte *)(in_RCX + 0x21) & 1) != 0)) {
    std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               CONCAT44(in_stack_fffffffffffffb0c,in_stack_fffffffffffffb08));
    CTransaction::GetHash
              ((CTransaction *)CONCAT44(in_stack_fffffffffffffb0c,in_stack_fffffffffffffb08));
    transaction_identifier::operator_cast_to_uint256_
              ((transaction_identifier<false> *)
               CONCAT44(in_stack_fffffffffffffb0c,in_stack_fffffffffffffb08));
    CTxMemPool::PrioritiseTransaction
              ((CTxMemPool *)CONCAT44(uVar8,in_stack_fffffffffffffbd8),(uint256 *)PVar6.m_params,
               (CAmount *)PVar6.m_object);
  }
  tx_00 = local_2c8;
  active_chainstate_00 =
       std::chrono::operator-
                 ((time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                   *)obj,(duration<long,_std::ratio<1L,_1L>_> *)
                         CONCAT44(in_stack_fffffffffffffb0c,in_stack_fffffffffffffb08));
  accept_time = TicksSinceEpoch<std::chrono::duration<long,std::ratio<1l,1l>>,std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>
                          (in_stack_fffffffffffffb18);
  if (accept_time < (long)tx_00) {
    pAVar2 = MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
                       ((AnnotatedMixin<std::recursive_mutex> *)
                        CONCAT44(in_stack_fffffffffffffb0c,in_stack_fffffffffffffb08));
    uVar3 = (undefined2)((ulong)pAVar2 >> 0x30);
    UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
              ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)
               CONCAT17(in_stack_fffffffffffffb4f,
                        CONCAT16(in_stack_fffffffffffffb4e,in_stack_fffffffffffffb48)),
               (AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffffb40,
               (char *)in_stack_fffffffffffffb38,in_stack_fffffffffffffb30,
               (int)((ulong)in_stack_fffffffffffffb28 >> 0x20),
               SUB81((ulong)in_stack_fffffffffffffb28 >> 0x18,0));
    AcceptToMemoryPool((Chainstate *)active_chainstate_00.__d.__r,tx_00,accept_time,
                       SUB21((ushort)uVar3 >> 8,0),SUB21(uVar3,0));
    if (local_e8 == 0) {
      local_1f0 = local_1f0 + 1;
    }
    else {
      in_stack_fffffffffffffb70 = in_RDI;
      std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)CONCAT44(in_stack_fffffffffffffb0c,in_stack_fffffffffffffb08));
      in_stack_fffffffffffffb78 =
           CTransaction::GetHash
                     ((CTransaction *)CONCAT44(in_stack_fffffffffffffb0c,in_stack_fffffffffffffb08))
      ;
      gtxid = (GenTxid *)
              transaction_identifier::operator_cast_to_uint256_
                        ((transaction_identifier<false> *)
                         CONCAT44(in_stack_fffffffffffffb0c,in_stack_fffffffffffffb08));
      GenTxid::Txid((uint256 *)CONCAT44(in_stack_fffffffffffffb0c,in_stack_fffffffffffffb08));
      bVar1 = CTxMemPool::exists(in_stack_fffffffffffffb70,gtxid);
      if (bVar1) {
        local_208 = local_208 + 1;
      }
      else {
        local_200 = local_200 + 1;
      }
    }
    MempoolAcceptResult::~MempoolAcceptResult
              ((MempoolAcceptResult *)CONCAT44(in_stack_fffffffffffffb0c,in_stack_fffffffffffffb08))
    ;
    UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
              ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)
               CONCAT44(in_stack_fffffffffffffb0c,in_stack_fffffffffffffb08));
  }
  else {
    local_1f8 = local_1f8 + 1;
  }
  bVar1 = util::SignalInterrupt::operator_cast_to_bool
                    ((SignalInterrupt *)
                     CONCAT44(in_stack_fffffffffffffb0c,in_stack_fffffffffffffb08));
  if (bVar1) {
    local_369 = 0;
  }
  std::shared_ptr<const_CTransaction>::~shared_ptr
            ((shared_ptr<const_CTransaction> *)
             CONCAT44(in_stack_fffffffffffffb0c,in_stack_fffffffffffffb08));
  iVar7 = (int)((ulong)in_stack_fffffffffffffb78 >> 0x20);
  if (bVar1) goto LAB_011dd9fb;
  goto LAB_011dd184;
}

Assistant:

bool LoadMempool(CTxMemPool& pool, const fs::path& load_path, Chainstate& active_chainstate, ImportMempoolOptions&& opts)
{
    if (load_path.empty()) return false;

    AutoFile file{opts.mockable_fopen_function(load_path, "rb")};
    if (file.IsNull()) {
        LogInfo("Failed to open mempool file. Continuing anyway.\n");
        return false;
    }

    int64_t count = 0;
    int64_t expired = 0;
    int64_t failed = 0;
    int64_t already_there = 0;
    int64_t unbroadcast = 0;
    const auto now{NodeClock::now()};

    try {
        uint64_t version;
        file >> version;
        std::vector<std::byte> xor_key;
        if (version == MEMPOOL_DUMP_VERSION_NO_XOR_KEY) {
            // Leave XOR-key empty
        } else if (version == MEMPOOL_DUMP_VERSION) {
            file >> xor_key;
        } else {
            return false;
        }
        file.SetXor(xor_key);
        uint64_t total_txns_to_load;
        file >> total_txns_to_load;
        uint64_t txns_tried = 0;
        LogInfo("Loading %u mempool transactions from file...\n", total_txns_to_load);
        int next_tenth_to_report = 0;
        while (txns_tried < total_txns_to_load) {
            const int percentage_done(100.0 * txns_tried / total_txns_to_load);
            if (next_tenth_to_report < percentage_done / 10) {
                LogInfo("Progress loading mempool transactions from file: %d%% (tried %u, %u remaining)\n",
                        percentage_done, txns_tried, total_txns_to_load - txns_tried);
                next_tenth_to_report = percentage_done / 10;
            }
            ++txns_tried;

            CTransactionRef tx;
            int64_t nTime;
            int64_t nFeeDelta;
            file >> TX_WITH_WITNESS(tx);
            file >> nTime;
            file >> nFeeDelta;

            if (opts.use_current_time) {
                nTime = TicksSinceEpoch<std::chrono::seconds>(now);
            }

            CAmount amountdelta = nFeeDelta;
            if (amountdelta && opts.apply_fee_delta_priority) {
                pool.PrioritiseTransaction(tx->GetHash(), amountdelta);
            }
            if (nTime > TicksSinceEpoch<std::chrono::seconds>(now - pool.m_opts.expiry)) {
                LOCK(cs_main);
                const auto& accepted = AcceptToMemoryPool(active_chainstate, tx, nTime, /*bypass_limits=*/false, /*test_accept=*/false);
                if (accepted.m_result_type == MempoolAcceptResult::ResultType::VALID) {
                    ++count;
                } else {
                    // mempool may contain the transaction already, e.g. from
                    // wallet(s) having loaded it while we were processing
                    // mempool transactions; consider these as valid, instead of
                    // failed, but mark them as 'already there'
                    if (pool.exists(GenTxid::Txid(tx->GetHash()))) {
                        ++already_there;
                    } else {
                        ++failed;
                    }
                }
            } else {
                ++expired;
            }
            if (active_chainstate.m_chainman.m_interrupt)
                return false;
        }
        std::map<uint256, CAmount> mapDeltas;
        file >> mapDeltas;

        if (opts.apply_fee_delta_priority) {
            for (const auto& i : mapDeltas) {
                pool.PrioritiseTransaction(i.first, i.second);
            }
        }

        std::set<uint256> unbroadcast_txids;
        file >> unbroadcast_txids;
        if (opts.apply_unbroadcast_set) {
            unbroadcast = unbroadcast_txids.size();
            for (const auto& txid : unbroadcast_txids) {
                // Ensure transactions were accepted to mempool then add to
                // unbroadcast set.
                if (pool.get(txid) != nullptr) pool.AddUnbroadcastTx(txid);
            }
        }
    } catch (const std::exception& e) {
        LogInfo("Failed to deserialize mempool data on file: %s. Continuing anyway.\n", e.what());
        return false;
    }

    LogInfo("Imported mempool transactions from file: %i succeeded, %i failed, %i expired, %i already there, %i waiting for initial broadcast\n", count, failed, expired, already_there, unbroadcast);
    return true;
}